

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_handle::
async_call<libtorrent::aux::torrent_peer*(libtorrent::aux::torrent::*)(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::peer_source_flags_tag,void>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::pex_flags_tag,void>),boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::peer_source_flags_tag,void>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::pex_flags_tag,void>const&>
          (torrent_handle *this,offset_in_torrent_to_subr f,basic_endpoint<boost::asio::ip::tcp> *a,
          bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void> *a_1,
          bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> *a_2)

{
  io_context *ctx;
  undefined1 *in_R9;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_78 [40];
  data_union local_50;
  uchar local_34;
  undefined1 local_33;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,this);
  if (local_88._M_ptr != (element_type *)0x0) {
    local_78._0_8_ = ((local_88._M_ptr)->super_torrent_hot_members).m_ses;
    ctx = ((session_impl *)local_78._0_8_)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),
               &local_88);
    local_50._0_8_ = *(undefined8 *)a_1;
    local_50._20_8_ = *(undefined8 *)(a_1 + 0x14);
    local_50._8_4_ = (undefined4)*(undefined8 *)(a_1 + 8);
    local_50._12_4_ = (undefined4)*(undefined8 *)(a_1 + 0xc);
    local_50._16_4_ = (undefined4)((ulong)*(undefined8 *)(a_1 + 0xc) >> 0x20);
    local_34 = a_2->m_val;
    local_33 = *in_R9;
    local_78._24_8_ = f;
    local_78._32_8_ = a;
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::torrent_handle::async_call<libtorrent::aux::torrent_peer*(libtorrent::aux::torrent::*)(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::peer_source_flags_tag,void>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::pex_flags_tag,void>),boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::peer_source_flags_tag,void>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::pex_flags_tag,void>const&>(libtorrent::aux::torrent_peer*(libtorrent::aux::torrent::*)(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::peer_source_flags_tag,void>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::pex_flags_tag,void>),boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::peer_source_flags_tag,void>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::pex_flags_tag,void>const&)const::_lambda()_1_>
              (ctx,(type_conflict15 *)local_78,(type *)0x0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x10));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    return;
  }
  local_78._0_4_ = 0x14;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_78);
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}